

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_1bc0bf::fillPixels<unsigned_int>
               (Array2D<unsigned_int> *ph,int width,int height)

{
  int iVar1;
  uint *puVar2;
  int in_EDX;
  int in_ESI;
  Array2D<unsigned_int> *in_RDI;
  Array2D<unsigned_int> *unaff_retaddr;
  int x;
  int y;
  int local_18;
  int local_14;
  
  Imf_3_4::Array2D<unsigned_int>::resizeErase(unaff_retaddr,(long)in_RDI,CONCAT44(in_ESI,in_EDX));
  for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      iVar1 = local_14 * in_ESI;
      puVar2 = Imf_3_4::Array2D<unsigned_int>::operator[](in_RDI,(long)local_14);
      puVar2[local_18] = (iVar1 + local_18) % 0x801;
    }
  }
  return;
}

Assistant:

void
fillPixels (Array2D<T>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            //
            // We do this because half cannot store number bigger than 2048 exactly.
            //
            ph[y][x] = (y * width + x) % 2049;
        }
}